

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

void __thiscall ON_PolynomialCurve::~ON_PolynomialCurve(ON_PolynomialCurve *this)

{
  ON_PolynomialCurve *this_local;
  
  Destroy(this);
  ON_4dPointArray::~ON_4dPointArray(&this->m_cv);
  return;
}

Assistant:

ON_PolynomialCurve::~ON_PolynomialCurve()
{
  Destroy();
}